

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Serializer.cpp
# Opt level: O0

void __thiscall
adios2::format::BP3Serializer::SerializeMetadataInData
          (BP3Serializer *this,bool updateAbsolutePosition,bool inData)

{
  byte in_DL;
  byte in_SIL;
  uint64_t *in_RDI;
  string *in_stack_00000030;
  size_t in_stack_00000038;
  BufferSTL *in_stack_00000040;
  uint64_t attributesIndexStart;
  uint64_t variablesIndexStart;
  uint64_t pgIndexStart;
  size_t *absolutePosition;
  size_t *position;
  vector<char,_std::allocator<char>_> *buffer;
  size_t footerSize;
  uint64_t attributesLength;
  uint32_t attributesCount;
  uint64_t varsLength;
  vector<char,_std::allocator<char>_> *in_stack_000000d0;
  uint32_t varsCount;
  uint64_t pgLength;
  uint64_t pgCount;
  anon_class_1_0_00000001 lf_FlattenIndices;
  undefined6 in_stack_000000e8;
  anon_class_1_0_00000001 lf_SetIndexCountLength;
  unsigned_long *__args_1;
  char (*__args) [10];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *this_00;
  unsigned_long *in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff49;
  anon_class_1_0_00000001 *in_stack_ffffffffffffff50;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BPBase::SerialElementIndex,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BPBase::SerialElementIndex>_>_>
  *in_stack_ffffffffffffff58;
  uint64_t in_stack_ffffffffffffff60;
  uint32_t in_stack_ffffffffffffff6c;
  anon_class_1_0_00000001 *in_stack_ffffffffffffff70;
  allocator local_81;
  string local_80 [32];
  long *local_60;
  char (*local_58) [10];
  unsigned_long *local_50;
  long local_48;
  long local_40;
  undefined4 local_34;
  long local_30;
  undefined4 local_24;
  size_type local_20;
  undefined8 local_18;
  byte local_a;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_a = in_DL & 1;
  local_18 = *(undefined8 *)((long)in_RDI + *(long *)(*in_RDI - 0x18) + 0x1a0);
  local_20 = std::vector<char,_std::allocator<char>_>::size
                       ((vector<char,_std::allocator<char>_> *)
                        ((long)in_RDI + *(long *)(*in_RDI - 0x18) + 0xe8));
  local_24 = 0;
  local_30 = 0;
  SerializeMetadataInData::anon_class_1_0_00000001::operator()
            (in_stack_ffffffffffffff50,
             (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BPBase::SerialElementIndex,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BPBase::SerialElementIndex>_>_>
              *)CONCAT71(in_stack_ffffffffffffff49,in_stack_ffffffffffffff48),
             (uint32_t *)in_stack_ffffffffffffff40,in_RDI);
  local_34 = 0;
  local_40 = 0;
  SerializeMetadataInData::anon_class_1_0_00000001::operator()
            (in_stack_ffffffffffffff50,
             (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BPBase::SerialElementIndex,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BPBase::SerialElementIndex>_>_>
              *)CONCAT71(in_stack_ffffffffffffff49,in_stack_ffffffffffffff48),
             (uint32_t *)in_stack_ffffffffffffff40,in_RDI);
  if ((local_a & 1) != 0) {
    local_48 = (ulong)*(uint *)((long)in_RDI + *(long *)(*in_RDI - 0x18) + 0x198) + 0x28 +
               local_30 + local_20 + local_40;
    local_50 = (unsigned_long *)((long)in_RDI + *(long *)(*in_RDI - 0x18) + 0x70);
    local_58 = (char (*) [10])((long)in_RDI + *(long *)(*in_RDI - 0x18) + 0x60);
    local_60 = (long *)((long)in_RDI + *(long *)(*in_RDI - 0x18) + 0x68);
    this_00 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               *)((long)in_RDI + *(long *)(*in_RDI - 0x18) + 0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80," when writing metadata in bp data buffer",&local_81);
    BufferSTL::Resize(in_stack_00000040,in_stack_00000038,in_stack_00000030);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    helper::CopyToBuffer<unsigned_long>
              ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff50,
               (size_t *)CONCAT71(in_stack_ffffffffffffff49,in_stack_ffffffffffffff48),
               in_stack_ffffffffffffff40,(size_t)in_RDI);
    helper::CopyToBuffer<unsigned_long>
              ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff50,
               (size_t *)CONCAT71(in_stack_ffffffffffffff49,in_stack_ffffffffffffff48),
               in_stack_ffffffffffffff40,(size_t)in_RDI);
    __args_1 = local_50;
    __args = local_58;
    std::vector<char,_std::allocator<char>_>::data((vector<char,_std::allocator<char>_> *)0xb353e3);
    helper::CopyToBuffer<char>
              ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff50,
               (size_t *)CONCAT71(in_stack_ffffffffffffff49,in_stack_ffffffffffffff48),
               (char *)in_stack_ffffffffffffff40,(size_t)in_RDI);
    SerializeMetadataInData::anon_class_1_0_00000001::operator()
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff58,
               (vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff50,
               (size_t *)CONCAT71(in_stack_ffffffffffffff49,in_stack_ffffffffffffff48));
    SerializeMetadataInData::anon_class_1_0_00000001::operator()
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff58,
               (vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff50,
               (size_t *)CONCAT71(in_stack_ffffffffffffff49,in_stack_ffffffffffffff48));
    BPSerializer::PutMinifooter
              ((BPSerializer *)this,
               CONCAT17(updateAbsolutePosition,CONCAT16(inData,in_stack_000000e8)),pgCount,pgLength,
               in_stack_000000d0,(size_t *)varsLength,attributesCount._3_1_);
    if ((local_9 & 1) != 0) {
      *local_60 = local_48 + *local_60;
    }
    if ((*(byte *)((long)in_RDI + *(long *)(*in_RDI - 0x18) + 0x2e8) & 1) != 0) {
      std::
      unordered_map<std::__cxx11::string,unsigned_long,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
      ::emplace<char_const(&)[10],unsigned_long&>(this_00,__args,__args_1);
    }
  }
  return;
}

Assistant:

void BP3Serializer::SerializeMetadataInData(const bool updateAbsolutePosition, const bool inData)
{
    auto lf_SetIndexCountLength = [](std::unordered_map<std::string, SerialElementIndex> &indices,
                                     uint32_t &count, uint64_t &length) {
        count = static_cast<uint32_t>(indices.size());
        length = 0;
        for (auto &indexPair : indices) // set each index length
        {
            auto &indexBuffer = indexPair.second.Buffer;
            const uint32_t indexLength = static_cast<uint32_t>(indexBuffer.size() - 4);
            size_t indexLengthPosition = 0;
            helper::CopyToBuffer(indexBuffer, indexLengthPosition, &indexLength);

            length += indexBuffer.size(); // overall length
        }
    };

    auto lf_FlattenIndices = [](const uint32_t count, const uint64_t length,
                                const std::unordered_map<std::string, SerialElementIndex> &indices,
                                std::vector<char> &buffer, size_t &position) {
        helper::CopyToBuffer(buffer, position, &count);
        helper::CopyToBuffer(buffer, position, &length);

        for (const auto &indexPair : indices) // set each index length
        {
            const auto &indexBuffer = indexPair.second.Buffer;
            helper::CopyToBuffer(buffer, position, indexBuffer.data(), indexBuffer.size());
        }
    };

    // Finish writing metadata counts and lengths
    // PG Index
    const uint64_t pgCount = m_MetadataSet.DataPGCount;
    const uint64_t pgLength = m_MetadataSet.PGIndex.Buffer.size();

    // var index count and length (total), and each index length
    uint32_t varsCount = 0;
    uint64_t varsLength = 0;
    lf_SetIndexCountLength(m_MetadataSet.VarsIndices, varsCount, varsLength);

    // attribute index count and length, and each index length
    uint32_t attributesCount = 0;
    uint64_t attributesLength = 0;
    lf_SetIndexCountLength(m_MetadataSet.AttributesIndices, attributesCount, attributesLength);

    if (!inData)
    {
        return;
    }

    const size_t footerSize =
        static_cast<size_t>((pgLength + 16) + (varsLength + 12) + (attributesLength + 12) +
                            m_MetadataSet.MiniFooterSize);

    auto &buffer = m_Data.m_Buffer;
    auto &position = m_Data.m_Position;
    auto &absolutePosition = m_Data.m_AbsolutePosition;

    // reserve data to fit metadata,
    // must replace with growth buffer strategy?
    m_Data.Resize(position + footerSize, " when writing metadata in bp data buffer");

    // write pg index
    helper::CopyToBuffer(buffer, position, &pgCount);
    helper::CopyToBuffer(buffer, position, &pgLength);
    helper::CopyToBuffer(buffer, position, m_MetadataSet.PGIndex.Buffer.data(),
                         static_cast<size_t>(pgLength));

    // Vars indices
    lf_FlattenIndices(varsCount, varsLength, m_MetadataSet.VarsIndices, buffer, position);
    // Attribute indices
    lf_FlattenIndices(attributesCount, attributesLength, m_MetadataSet.AttributesIndices, buffer,
                      position);

    // getting absolute offset start, minifooter is 28 bytes for now
    const uint64_t pgIndexStart = static_cast<uint64_t>(absolutePosition);
    const uint64_t variablesIndexStart = static_cast<uint64_t>(pgIndexStart + (pgLength + 16));
    const uint64_t attributesIndexStart =
        static_cast<uint64_t>(variablesIndexStart + (varsLength + 12));

    PutMinifooter(pgIndexStart, variablesIndexStart, attributesIndexStart, buffer, position);

    if (updateAbsolutePosition)
    {
        absolutePosition += footerSize;
    }

    if (m_Profiler.m_IsActive)
    {
        m_Profiler.m_Bytes.emplace("buffering", absolutePosition);
    }
}